

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::createCaseGroup
               (TestCaseGroup *parent,char *groupName,char *groupDesc,TexFuncCaseSpec *cases,
               int numCases)

{
  uint uVar1;
  TestContext *pTVar2;
  TestNode *this;
  long *plVar3;
  TestNode *node;
  ShaderTextureFunctionCase *pSVar4;
  size_type *psVar5;
  byte bVar6;
  ulong uVar7;
  TextureSpec *texture;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  ShaderTextureFunctionCase *local_88;
  TestNode *local_80;
  TextureLookupSpec *local_78;
  string local_70;
  string name;
  
  uVar7 = (ulong)(uint)numCases;
  this = (TestNode *)operator_new(0x70);
  local_80 = &parent->super_TestNode;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this,(parent->super_TestNode).m_testCtx,groupName,groupDesc);
  if (0 < numCases) {
    texture = &cases->texSpec;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&name,*(char **)&texture[-2].sampler.normalizedCoords,
                 (allocator<char> *)&local_c8);
      uVar1 = texture[-2].sampler.compareChannel;
      bVar6 = 0;
      if ((2 < uVar1 - 9) && (2 < (uVar1 & 0xfffffffb) - 1)) {
        bVar6 = 1;
        if (texture->type < TEXTURETYPE_LAST) {
          bVar6 = 0x2e >> ((byte)texture->type & 0x1f);
        }
      }
      local_78 = (TextureLookupSpec *)&texture[-2].sampler.compareChannel;
      if ((texture[1].height & 1) != 0) {
        if ((bVar6 & 1) != 0) {
          local_88 = (ShaderTextureFunctionCase *)operator_new(0x1d8);
          pTVar2 = local_80->m_testCtx;
          std::operator+(&local_a8,"sparse_",&name);
          plVar3 = (long *)std::__cxx11::string::append((char *)&local_a8);
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          psVar5 = (size_type *)(plVar3 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar3 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar5) {
            local_c8.field_2._M_allocated_capacity = *psVar5;
            local_c8.field_2._8_4_ = (undefined4)plVar3[3];
            local_c8.field_2._12_4_ = *(undefined4 *)((long)plVar3 + 0x1c);
          }
          else {
            local_c8.field_2._M_allocated_capacity = *psVar5;
            local_c8._M_dataplus._M_p = (pointer)*plVar3;
          }
          local_c8._M_string_length = plVar3[1];
          *plVar3 = (long)psVar5;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
          pSVar4 = local_88;
          SparseShaderTextureFunctionCase::SparseShaderTextureFunctionCase
                    ((SparseShaderTextureFunctionCase *)local_88,pTVar2,&local_c8,&local_70,local_78
                     ,texture,*(TexEvalFunc *)&texture[1].format,true);
          tcu::TestNode::addChild(this,(TestNode *)pSVar4);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
        }
        local_88 = (ShaderTextureFunctionCase *)operator_new(0x1d8);
        pTVar2 = local_80->m_testCtx;
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_c8,name._M_dataplus._M_p,
                   name._M_dataplus._M_p + name._M_string_length);
        std::__cxx11::string::append((char *)&local_c8);
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"");
        pSVar4 = local_88;
        ShaderTextureFunctionCase::ShaderTextureFunctionCase
                  (local_88,pTVar2,&local_c8,&local_a8,local_78,texture,
                   *(TexEvalFunc *)&texture[1].format,true);
        tcu::TestNode::addChild(this,(TestNode *)pSVar4);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
      }
      if ((texture[1].height & 2) != 0) {
        if ((bVar6 & 1) != 0) {
          node = (TestNode *)operator_new(0x1d8);
          pTVar2 = local_80->m_testCtx;
          std::operator+(&local_a8,"sparse_",&name);
          plVar3 = (long *)std::__cxx11::string::append((char *)&local_a8);
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          psVar5 = (size_type *)(plVar3 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar3 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar5) {
            local_c8.field_2._M_allocated_capacity = *psVar5;
            local_c8.field_2._8_4_ = (undefined4)plVar3[3];
            local_c8.field_2._12_4_ = *(undefined4 *)((long)plVar3 + 0x1c);
          }
          else {
            local_c8.field_2._M_allocated_capacity = *psVar5;
            local_c8._M_dataplus._M_p = (pointer)*plVar3;
          }
          local_c8._M_string_length = plVar3[1];
          *plVar3 = (long)psVar5;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
          SparseShaderTextureFunctionCase::SparseShaderTextureFunctionCase
                    ((SparseShaderTextureFunctionCase *)node,pTVar2,&local_c8,&local_70,local_78,
                     texture,*(TexEvalFunc *)&texture[1].format,false);
          tcu::TestNode::addChild(this,node);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
        }
        pSVar4 = (ShaderTextureFunctionCase *)operator_new(0x1d8);
        pTVar2 = local_80->m_testCtx;
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_c8,name._M_dataplus._M_p,
                   name._M_dataplus._M_p + name._M_string_length);
        std::__cxx11::string::append((char *)&local_c8);
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"");
        ShaderTextureFunctionCase::ShaderTextureFunctionCase
                  (pSVar4,pTVar2,&local_c8,&local_a8,local_78,texture,
                   *(TexEvalFunc *)&texture[1].format,false);
        tcu::TestNode::addChild(this,(TestNode *)pSVar4);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
      }
      texture = (TextureSpec *)&texture[2].sampler.compareChannel;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  tcu::TestNode::addChild(local_80,this);
  return;
}

Assistant:

static void createCaseGroup (tcu::TestCaseGroup* parent, const char* groupName, const char* groupDesc, const TexFuncCaseSpec* cases, int numCases)
{
	de::MovePtr<tcu::TestCaseGroup>	group	(new tcu::TestCaseGroup(parent->getTestContext(), groupName, groupDesc));

	for (int ndx = 0; ndx < numCases; ndx++)
	{
		std::string	name			= cases[ndx].name;
		bool		sparseSupported	= !functionHasProj(cases[ndx].lookupSpec.function)		&&
									  TEXTURETYPE_1D			!= cases[ndx].texSpec.type	&&
									  TEXTURETYPE_1D_ARRAY		!= cases[ndx].texSpec.type	&&
									  TEXTURETYPE_CUBE_ARRAY	!= cases[ndx].texSpec.type;

		if (cases[ndx].flags & VERTEX)
		{
			if (sparseSupported)
				group->addChild(new SparseShaderTextureFunctionCase(parent->getTestContext(), ("sparse_" + name + "_vertex"),   "", cases[ndx].lookupSpec, cases[ndx].texSpec, cases[ndx].evalFunc, true ));

			group->addChild(new ShaderTextureFunctionCase(parent->getTestContext(), (name + "_vertex"),   "", cases[ndx].lookupSpec, cases[ndx].texSpec, cases[ndx].evalFunc, true ));
		}

		if (cases[ndx].flags & FRAGMENT)
		{
			if (sparseSupported)
				group->addChild(new SparseShaderTextureFunctionCase(parent->getTestContext(), ("sparse_" + name + "_fragment"), "", cases[ndx].lookupSpec, cases[ndx].texSpec, cases[ndx].evalFunc, false));

			group->addChild(new ShaderTextureFunctionCase(parent->getTestContext(), (name + "_fragment"), "", cases[ndx].lookupSpec, cases[ndx].texSpec, cases[ndx].evalFunc, false));
		}
	}

	parent->addChild(group.release());
}